

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkIsAcyclic(Abc_Ntk_t *pNtk)

{
  FILE *__stream;
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int local_20;
  int local_1c;
  int i;
  int fAcyclic;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  Abc_NtkIncrementTravId(pNtk);
  local_1c = 1;
  local_20 = 0;
  while( true ) {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_20) {
      return local_1c;
    }
    pAVar2 = Abc_NtkCo(pNtk,local_20);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    pAVar2 = Abc_ObjFanin0Ntk(pAVar2);
    iVar1 = Abc_NodeIsTravIdPrevious(pAVar2);
    if ((iVar1 == 0) && (local_1c = Abc_NtkIsAcyclic_rec(pAVar2), __stream = _stdout, local_1c == 0)
       ) break;
    local_20 = local_20 + 1;
  }
  pAVar2 = Abc_ObjFanout0(pAVar2);
  pcVar3 = Abc_ObjName(pAVar2);
  fprintf(__stream," CO \"%s\"\n",pcVar3);
  return 0;
}

Assistant:

int Abc_NtkIsAcyclic( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Abc_NtkIncrementTravId( pNtk );   
    Abc_NtkIncrementTravId( pNtk );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
        if ( Abc_NodeIsTravIdPrevious(pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pNode)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " CO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        break;
    }
    return fAcyclic;
}